

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
embree::ThinDielectricMaterial::ThinDielectricMaterial
          (ThinDielectricMaterial *this,Vec3fa *transmission,float eta,float thickness)

{
  undefined8 uVar1;
  float *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float in_XMM1_Da;
  string *in_stack_fffffffffffffe68;
  MaterialNode *in_stack_fffffffffffffe70;
  undefined8 *puVar5;
  undefined1 local_168 [39];
  allocator local_141;
  string local_140 [32];
  float local_120;
  undefined4 local_11c;
  float *local_118;
  float *local_108;
  undefined8 *local_100;
  float *pfStack_a0;
  undefined1 *local_98;
  
  local_120 = in_XMM1_Da;
  local_11c = in_XMM0_Da;
  local_118 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"",&local_141);
  SceneGraph::MaterialNode::MaterialNode(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  *in_RDI = &PTR__ThinDielectricMaterial_00605b40;
  Material::Material((Material *)(in_RDI + 0xe),MATERIAL_THIN_DIELECTRIC);
  local_100 = in_RDI + 0x10;
  local_108 = local_118;
  uVar1 = *(undefined8 *)(local_118 + 2);
  *local_100 = *(undefined8 *)local_118;
  in_RDI[0x11] = uVar1;
  puVar5 = in_RDI + 0x12;
  local_98 = local_168;
  pfStack_a0 = local_118;
  fVar2 = logf(*local_118);
  fVar3 = logf(pfStack_a0[1]);
  fVar4 = logf(pfStack_a0[2]);
  *puVar5 = CONCAT44(fVar3 * local_120,fVar2 * local_120);
  puVar5[1] = CONCAT44(local_120 * 0.0,fVar4 * local_120);
  *(undefined4 *)(in_RDI + 0x14) = local_11c;
  *(float *)((long)in_RDI + 0xa4) = local_120;
  return;
}

Assistant:

ThinDielectricMaterial (const Vec3fa& transmission, const float eta, const float thickness)
      : base(MATERIAL_THIN_DIELECTRIC), transmission(transmission), transmissionFactor(log(transmission)*thickness), eta(eta), thickness(thickness) {}